

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

Time __thiscall helics::Federate::requestTime(Federate *this,Time nextInternalTimeStep)

{
  string_view message;
  Time nextStep;
  Time newTime_00;
  Modes MVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  undefined8 uVar4;
  undefined8 in_RSI;
  Federate *in_RDI;
  FunctionExecutionFailure *anon_var_0;
  RegistrationFailure *anon_var_0_1;
  Time newTime;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  bool bVar5;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar6;
  TimeRepresentation<count_time<9,_long>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> *local_50;
  undefined8 local_48;
  uint local_3c;
  basic_string_view<char,_std::char_traits<char>_> *local_38;
  undefined8 local_20;
  undefined8 local_10;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  local_10 = in_RSI;
  MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x31180d);
  if (MVar1 == EXECUTING) {
    uVar6 = 2;
    do {
      local_20 = local_10;
      nextStep.internalTimeCode._7_1_ = uVar6;
      nextStep.internalTimeCode._0_7_ = in_stack_ffffffffffffff80;
      preTimeRequestOperations(in_RDI,nextStep,SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0));
      peVar3 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x31186e);
      local_3c = (in_RDI->fedID).fid;
      local_48 = local_10;
      iVar2 = (*peVar3->_vptr_Core[0x1a])(peVar3,(ulong)local_3c,local_10);
      in_stack_ffffffffffffff70 =
           (basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(extraout_var,iVar2);
      newTime_00.internalTimeCode._7_1_ = uVar6;
      newTime_00.internalTimeCode._0_7_ = in_stack_ffffffffffffff80;
      local_50 = in_stack_ffffffffffffff70;
      local_38 = in_stack_ffffffffffffff70;
      local_8.internalTimeCode = (baseType)in_stack_ffffffffffffff70;
      postTimeRequestOperations(in_RDI,newTime_00,SUB41((uint)extraout_var >> 0x18,0));
      bVar5 = false;
      if ((in_RDI->retriggerTimeRequest & 1U) != 0) {
        local_58 = TimeRepresentation<count_time<9,_long>_>::maxVal();
        bVar5 = TimeRepresentation<count_time<9,_long>_>::operator<(&local_8,&local_58);
      }
    } while (bVar5 != false);
  }
  else {
    if ((MVar1 != FINALIZE) && (MVar1 != FINISHED)) {
      uVar4 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff70,
                 (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      message._M_str._0_7_ = in_stack_ffffffffffffff80;
      message._M_len = (size_t)in_RDI;
      message._M_str._7_1_ = MVar1;
      InvalidFunctionCall::InvalidFunctionCall
                ((InvalidFunctionCall *)in_stack_ffffffffffffff70,message);
      __cxa_throw(uVar4,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
    }
    local_8 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  }
  return (Time)local_8.internalTimeCode;
}

Assistant:

Time Federate::requestTime(Time nextInternalTimeStep)
{
    switch (currentMode) {
        case Modes::EXECUTING:
            try {
                Time newTime;
                do {
                    preTimeRequestOperations(nextInternalTimeStep, false);
                    newTime = coreObject->timeRequest(fedID, nextInternalTimeStep);
                    postTimeRequestOperations(newTime, false);
                } while (retriggerTimeRequest && newTime < Time::maxVal());

                return newTime;
            }
            catch (const FunctionExecutionFailure&) {
                updateFederateMode(Modes::ERROR_STATE);
                throw;
            }
            catch (const RegistrationFailure&) {
                updateFederateMode(Modes::ERROR_STATE);
                throw;
            }
            break;
        case Modes::FINALIZE:
        case Modes::FINISHED:
            return Time::maxVal();
        default:
            break;
    }

    throw(InvalidFunctionCall("cannot call request time in present state"));
}